

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_size::test_method(addrman_size *this)

{
  size_type *psVar1;
  long lVar2;
  __single_object _Var3;
  readonly_property65 rVar4;
  bool bVar5;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<CAddress> __l;
  const_string file_04;
  const_string file_05;
  initializer_list<CAddress> __l_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  check_type cVar9;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined4 local_484;
  size_t local_480;
  assertion_result local_478;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  __single_object addrman;
  undefined4 *local_230;
  assertion_result local_228;
  undefined4 **local_210;
  size_t *local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined1 local_1f0 [16];
  shared_count sStack_1e0;
  undefined1 local_1d8 [16];
  shared_count sStack_1c8;
  undefined ***local_1c0;
  uint16_t local_1b8;
  NodeSeconds local_1b0;
  ServiceFlags SStack_1a8;
  direct_or_indirect local_1a0;
  uint local_190;
  Network local_188;
  uint32_t uStack_184;
  uint16_t local_180;
  CService i2p_addr;
  CAddress addr3;
  direct_or_indirect local_118;
  uint local_108;
  Network local_100;
  uint32_t uStack_fc;
  uint16_t local_f8;
  CAddress addr2;
  direct_or_indirect local_b8;
  uint local_a8;
  Network local_a0;
  uint32_t uStack_9c;
  uint16_t local_98;
  CAddress addr1;
  CNetAddr source;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  psVar1 = &addr1.super_CService.super_CNetAddr.m_addr._size;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr1,"252.2.2.2","");
  ResolveIP(&source,(string *)&addr1);
  if ((size_type *)addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr1.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x472;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_228._0_8_ = local_1f0;
  local_478._0_8_ = &local_200;
  local_200._0_4_ = 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_228;
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  addr2.super_CService.super_CNetAddr._24_8_ = &local_478;
  local_1d8[0] = local_1f0._0_8_ == 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&addr3,1,2,REQUIRE,0xe54565,
             (size_t)&i2p_addr,0x472,&addr1,"0U",&addr2);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x473;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_200._0_4_ = 0;
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_228;
  local_478._0_8_ = &local_200;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  addr2.super_CService.super_CNetAddr._24_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&addr3,1,2,REQUIRE,0xe54590,
             (size_t)&i2p_addr,0x473,&addr1,"0U",&addr2);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x474;
  file_01.m_begin = (iterator)&local_288;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
             msg_01);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x101);
  local_200._0_4_ = 0;
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_228;
  local_478._0_8_ = &local_200;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  addr2.super_CService.super_CNetAddr._24_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&addr3,1,2,REQUIRE,0xe545b7,
             (size_t)&i2p_addr,0x474,&addr1,"0U",&addr2);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x475;
  file_02.m_begin = (iterator)&local_2a8;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     (optional<Network>)0x100000001,(optional<bool>)0x100);
  local_200 = (char *)((ulong)local_200._4_4_ << 0x20);
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_228;
  local_478._0_8_ = &local_200;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  addr2.super_CService.super_CNetAddr._24_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&addr3,1,2,REQUIRE,0xe545da,
             (size_t)&i2p_addr,0x475,&addr1,"0U",&addr2);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  psVar1 = &addr2.super_CService.super_CNetAddr.m_addr._size;
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr2,"250.1.1.1","");
  ResolveService((CService *)&local_b8.indirect_contents,(string *)&addr2,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  addr1.super_CService.super_CNetAddr.m_net = local_a0;
  addr1.super_CService.super_CNetAddr.m_scope_id = uStack_9c;
  addr1.super_CService.port = local_98;
  addr1.nTime.__d.__r = (duration)100000000;
  addr1.nServices = NODE_NONE;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr2.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x479;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  _Var3 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  addr2.super_CService.super_CNetAddr.m_net = addr1.super_CService.super_CNetAddr.m_net;
  addr2.super_CService.super_CNetAddr.m_scope_id = addr1.super_CService.super_CNetAddr.m_scope_id;
  addr2.super_CService.port = addr1.super_CService.port;
  addr2.nTime = addr1.nTime;
  addr2.nServices = addr1.nServices;
  __l._M_len = 1;
  __l._M_array = &addr2;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr,__l,
             (allocator_type *)&local_478);
  _cVar9 = 0x2514b1;
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr,&source,(seconds)0x0);
  local_1d8[0] = rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ = "addrman->Add({addr1}, source)";
  local_228.m_message.px = (element_type *)0xe54617;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = &local_228;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2e0 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&addr3,1,0,WARN,_cVar9,(size_t)&local_2e8
             ,0x479);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&i2p_addr);
  if (0x10 < addr2.super_CService.super_CNetAddr.m_addr._size) {
    free(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x47a;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  _Var3 = addrman;
  tVar6 = NodeClock::now();
  _cVar9 = 0x2515db;
  bVar5 = AddrMan::Good((AddrMan *)
                        _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr1.super_CService,
                        (NodeSeconds)((long)tVar6.__d.__r / 1000000000));
  addr3.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar5;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_1d8._0_8_ = "addrman->Good(addr1)";
  local_1d8._8_8_ = (long)"addrman->Good(addr1)" + 0x14;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_310 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  addr2.super_CService.super_CNetAddr._24_8_ = (assertion_result *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr3,(lazy_ostream *)&addr2,1,0,WARN,_cVar9,(size_t)&local_318,
             0x47a);
  psVar1 = &addr3.super_CService.super_CNetAddr.m_addr._size;
  boost::detail::shared_count::~shared_count((shared_count *)psVar1);
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr3,"250.1.1.2","");
  ResolveService((CService *)&local_118.indirect_contents,(string *)&addr3,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_118.indirect_contents);
  addr2.super_CService.super_CNetAddr.m_net = local_100;
  addr2.super_CService.super_CNetAddr.m_scope_id = uStack_fc;
  addr2.super_CService.port = local_f8;
  addr2.nTime.__d.__r = (duration)100000000;
  addr2.nServices = NODE_NONE;
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
    local_118.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      &addr3.super_CService.super_CNetAddr.m_addr._size) {
    operator_delete(addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr3.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x47c;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  _Var3 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  addr3.super_CService.super_CNetAddr.m_net = addr2.super_CService.super_CNetAddr.m_net;
  addr3.super_CService.super_CNetAddr.m_scope_id = addr2.super_CService.super_CNetAddr.m_scope_id;
  addr3.super_CService.port = addr2.super_CService.port;
  addr3.nTime = addr2.nTime;
  addr3.nServices = addr2.nServices;
  __l_00._M_len = 1;
  __l_00._M_array = &addr3;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_228,__l_00,
             (allocator_type *)local_1f0);
  _cVar9 = 0x2517e0;
  bVar5 = AddrMan::Add((AddrMan *)
                       _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_228,&source,
                       (seconds)0x0);
  i2p_addr.super_CNetAddr.m_addr._union.direct[0] = bVar5;
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ = 0;
  i2p_addr.super_CNetAddr.m_addr._size = 0;
  i2p_addr.super_CNetAddr.m_addr._20_4_ = 0;
  local_478._0_8_ = "addrman->Add({addr2}, source)";
  local_478.m_message.px = (element_type *)0xe5464a;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_478;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_340 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&i2p_addr,(lazy_ostream *)local_1d8,1,0,WARN,_cVar9,
             (size_t)&local_348,0x47c);
  boost::detail::shared_count::~shared_count((shared_count *)&i2p_addr.super_CNetAddr.m_addr._size);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_228);
  if (0x10 < addr3.super_CService.super_CNetAddr.m_addr._size) {
    free(addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x47e;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_1f0._0_8_ = &local_208;
  local_200 = (char *)&local_230;
  local_230._0_4_ = 2;
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_208 == (size_t *)0x2);
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe54565,(size_t)&local_478,0x47e,
             &addr3,"2U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x47f;
  file_07.m_begin = (iterator)&local_378;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_388,
             msg_07);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_230._0_4_ = 2;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x2);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  local_1f0._0_8_ = &local_208;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe54590,(size_t)&local_478,0x47f,
             &addr3,"2U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x480;
  file_08.m_begin = (iterator)&local_398;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3a8,
             msg_08);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x101);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  local_1f0._0_8_ = &local_208;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe545b7,(size_t)&local_478,0x480,
             &addr3,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x481;
  file_09.m_begin = (iterator)&local_3b8;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3c8,
             msg_09);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x100);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  local_1f0._0_8_ = &local_208;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe5464b,(size_t)&local_478,0x481,
             &addr3,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x482;
  file_10.m_begin = (iterator)&local_3d8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8,
             msg_10);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x101);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  local_1f0._0_8_ = &local_208;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe5466f,(size_t)&local_478,0x482,
             &addr3,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x483;
  file_11.m_begin = (iterator)&local_3f8;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_408,
             msg_11);
  i2p_addr.super_CNetAddr.m_addr._union._8_8_ =
       i2p_addr.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  i2p_addr.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  i2p_addr.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x100);
  local_230 = (undefined4 *)CONCAT44(local_230._4_4_,1);
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe52ae3;
  local_1f0._0_8_ = &local_208;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "@;\x1f";
  addr3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr3.super_CService.super_CNetAddr._24_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abbb0;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&i2p_addr,1,2,REQUIRE,0xe545da,(size_t)&local_478,0x483,
             &addr3,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  CService::CService(&i2p_addr);
  addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&addr3.super_CService.super_CNetAddr.m_addr._size;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&addr3,"UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P","");
  CNetAddr::SetSpecial(&i2p_addr.super_CNetAddr,(string *)&addr3);
  if ((size_type *)addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      &addr3.super_CService.super_CNetAddr.m_addr._size) {
    operator_delete(addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr3.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&i2p_addr);
  local_188 = i2p_addr.super_CNetAddr.m_net;
  uStack_184 = i2p_addr.super_CNetAddr.m_scope_id;
  local_180 = i2p_addr.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents);
  addr3.super_CService.super_CNetAddr.m_net = local_188;
  addr3.super_CService.super_CNetAddr.m_scope_id = uStack_184;
  addr3.super_CService.port = local_180;
  addr3.nTime.__d.__r = (duration)100000000;
  addr3.nServices = NODE_NONE;
  if (0x10 < local_190) {
    free(local_1a0.indirect_contents.indirect);
    local_1a0.indirect_contents.indirect = (char *)0x0;
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x489;
  file_12.m_begin = (iterator)&local_418;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_428,
             msg_12);
  _Var3 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_1d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  local_1c0 = (undefined ***)addr3.super_CService.super_CNetAddr._24_8_;
  local_1b8 = addr3.super_CService.port;
  local_1b0 = (NodeSeconds)(NodeSeconds)addr3.nTime.__d.__r;
  SStack_1a8 = addr3.nServices;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1f0,__l_01,
             (allocator_type *)&local_208);
  _cVar9 = 0x2523a1;
  bVar5 = AddrMan::Add((AddrMan *)
                       _Var3._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_1f0,&source,(seconds)0x0
                      );
  local_478.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar5;
  local_478.m_message.px = (element_type *)0x0;
  local_478.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "addrman->Add({addr3}, source)";
  local_1f8 = "";
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abc70;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = (undefined4 **)&local_200;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_430 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_478,(lazy_ostream *)&local_228,1,0,WARN,_cVar9,(size_t)&local_438,0x489);
  boost::detail::shared_count::~shared_count(&local_478.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1f0);
  if (0x10 < (uint)sStack_1c8.pi_) {
    free((void *)local_1d8._0_8_);
    local_1d8._0_8_ = (_func_int **)0x0;
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x48a;
  file_13.m_begin = (iterator)&local_448;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_458,
             msg_13);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_208 = &local_480;
  local_230 = &local_484;
  local_484 = 3;
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  local_1f0[0] = (class_property<bool>)(class_property<bool>)(local_480 == 3);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe54565,
             (size_t)&local_200,0x48a,(iterator)local_1d8,"3U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x48b;
  file_14.m_begin = (iterator)&local_498;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4a8,
             msg_14);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_484 = 2;
  local_1f0[0] = (class_property<bool>)(local_480 == 2);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe54590,
             (size_t)&local_200,0x48b,(iterator)local_1d8,"2U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x48c;
  file_15.m_begin = (iterator)&local_4b8;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c8,
             msg_15);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000004,(optional<bool>)0x0);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe546e9,
             (size_t)&local_200,0x48c,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x48d;
  file_16.m_begin = (iterator)&local_4d8;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4e8,
             msg_16);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000004,(optional<bool>)0x101);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe5470f,
             (size_t)&local_200,0x48d,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x48e;
  file_17.m_begin = (iterator)&local_4f8;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_508,
             msg_17);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x101);
  local_484 = 2;
  local_1f0[0] = (class_property<bool>)(local_480 == 2);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe545b7,
             (size_t)&local_200,0x48e,(iterator)local_1d8,"2U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x48f;
  file_18.m_begin = (iterator)&local_518;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_528,
             msg_18);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_013abb30;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x100);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe5464b,
             (size_t)&local_200,0x48f,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  if (0x10 < addr3.super_CService.super_CNetAddr.m_addr._size) {
    free(addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < i2p_addr.super_CNetAddr.m_addr._size) {
    free(i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    i2p_addr.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr2.super_CService.super_CNetAddr.m_addr._size) {
    free(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < addr1.super_CService.super_CNetAddr.m_addr._size) {
    free(addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < source.m_addr._size) {
    free(source.m_addr._union.indirect_contents.indirect);
    source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_size)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    const CNetAddr source = ResolveIP("252.2.2.2");

    // empty addrman
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 0U);

    // add two ipv4 addresses, one to tried and new
    const CAddress addr1{ResolveService("250.1.1.1", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr1}, source));
    BOOST_CHECK(addrman->Good(addr1));
    const CAddress addr2{ResolveService("250.1.1.2", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr2}, source));

    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 1U);

    // add one i2p address to new
    CService i2p_addr;
    i2p_addr.SetSpecial("UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P");
    const CAddress addr3{i2p_addr, NODE_NONE};
    BOOST_CHECK(addrman->Add({addr3}, source));
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 3U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/std::nullopt), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
}